

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.c
# Opt level: O3

uint main(void)

{
  undefined4 *puVar1;
  int *__ptr;
  int *piVar2;
  ulong uVar3;
  int *piVar4;
  char *__format;
  uint uVar5;
  char *pcVar6;
  uint i;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  
  puVar1 = (undefined4 *)calloc(4,4);
  *puVar1 = 4;
  puVar1[1] = 5;
  puVar1[2] = 6;
  puVar1[3] = 7;
  uVar7 = 0;
  do {
    uVar3 = uVar7;
    if (uVar3 == 3) break;
    uVar7 = uVar3 + 1;
  } while (puVar1[uVar3 + 1] == (&DAT_00102124)[uVar3]);
  test_n = test_n + 1;
  pcVar8 = "test %d passed\n";
  pcVar6 = "test %d passed\n";
  if (uVar3 < 3) {
    pcVar6 = "test %d failed\n";
  }
  uVar7 = 0;
  printf(pcVar6);
  total = total + (uVar3 < 3);
  free(puVar1);
  __ptr = (int *)calloc(6,4);
  piVar2 = &DAT_001020b4;
  do {
    piVar4 = (int *)(&DAT_001020c0 + (ulong)((int)uVar7 - 3) * 4);
    if (uVar7 < 3) {
      piVar4 = piVar2;
    }
    __ptr[uVar7] = *piVar4;
    uVar7 = uVar7 + 1;
    piVar2 = piVar2 + 1;
  } while (uVar7 != 6);
  if (*__ptr == 0) {
    uVar7 = 0;
    do {
      uVar3 = uVar7;
      if (uVar3 == 5) break;
      uVar7 = uVar3 + 1;
    } while ((&DAT_001020d4)[uVar3] == __ptr[uVar3 + 1]);
    uVar5 = (uint)(uVar3 < 5);
    if (uVar3 < 5) {
      pcVar8 = "test %d failed\n";
    }
  }
  else {
    uVar5 = 1;
    pcVar8 = "test %d failed\n";
  }
  test_n = test_n + 1;
  lVar9 = 0;
  printf(pcVar8);
  total = total + uVar5;
  test_n = test_n + 1;
  __format = "test %d passed\n";
  printf("test %d passed\n");
  free(__ptr);
  test_n = test_n + 1;
  printf("test %d passed\n");
  test_n = test_n + 1;
  printf("test %d passed\n");
  test_n = test_n + 1;
  printf("test %d passed\n");
  pcVar6 = (char *)calloc(0xc,1);
  pcVar8 = pcVar6;
  do {
    *pcVar8 = *(char *)((long)L"hello world" + lVar9);
    lVar9 = lVar9 + 4;
    pcVar8 = pcVar8 + 1;
  } while (lVar9 != 0x2c);
  if (*pcVar6 == 'h') {
    uVar7 = 0;
    do {
      uVar3 = uVar7;
      if (uVar3 == 10) break;
      uVar7 = uVar3 + 1;
    } while ("hello world"[uVar3 + 1] == pcVar6[uVar3 + 1]);
    uVar5 = (uint)(uVar3 < 10);
    if (uVar3 < 10) {
      __format = "test %d failed\n";
    }
  }
  else {
    __format = "test %d failed\n";
    uVar5 = 1;
  }
  test_n = test_n + 1;
  printf(__format);
  total = total + uVar5;
  free(pcVar6);
  test_n = test_n + 1;
  printf("test %d passed\n");
  puVar1 = (undefined4 *)calloc(5,1);
  *puVar1 = 0x206f6c6c;
  uVar7 = 0;
  do {
    uVar3 = uVar7;
    if (uVar3 == 4) break;
    uVar7 = uVar3 + 1;
  } while ((&DAT_00102082)[uVar3] == *(char *)((long)puVar1 + uVar3 + 1));
  test_n = test_n + 1;
  pcVar8 = "test %d failed\n";
  if (3 < uVar3) {
    pcVar8 = "test %d passed\n";
  }
  printf(pcVar8);
  total = total + (uVar3 < 4);
  test_n = test_n + 1;
  printf("test %d passed\n");
  free(puVar1);
  test_n = test_n + 1;
  printf("test %d passed\n");
  return total;
}

Assistant:

uint32_t main()
{
    { // submatrix test
        uint32_t a[] = {1, 2, 3, 4, 5, 6, 7, 8, 9};
        uint32_t *b = submatrix(a, 3, 7);
        uint32_t c[] = {4, 5, 6, 7};
        REQUIRE(AR_EQ(b, c, LEN(c)));
        vector_free(b);
    }

    { // stack test
        uint32_t a[] = {0, 1, 2};
        uint32_t b[] = {4, 5, 6};
        uint32_t d[] = {0, 1, 2, 4, 5, 6};
        uint32_t c_len = 0;
        uint32_t *c = stack(a, 3, b, 3, &c_len);
        REQUIRE(AR_EQ(d, c, LEN(d)));
        REQUIRE(c_len == LEN(d));
        vector_free(c);
    }

    { // vector copy test
        uint32_t a[] = {5, 10, 100};
        uint32_t len = LEN(a);
        uint32_t *b = vector_copy(a, len);
        REQUIRE(AR_EQ(a, b, len));
        vector_free(b);
    }

    { // vector sum test
        uint32_t a[] = {1, 2, 3};
        uint32_t b[] = {9, 8, 7};
        uint32_t c[] = {10, 10, 10};
        uint32_t s_len = 0;
        uint32_t *s = vector_sum(a, LEN(a), b, LEN(b), &s_len);
        REQUIRE(AR_EQ(c, s, LEN(c)));
        REQUIRE(s_len == LEN(c));
        vector_free(s);
    }

    { // vector to str test
        uint8_t *expected = "hello world";
        uint32_t v[] = {104, 101, 108, 108, 111, 32, 119, 111, 114, 108, 100};
        uint8_t *actual = vector_to_str(v, LEN(v));
        REQUIRE(STR_EQ(expected, actual, LEN(v)));
        free(actual);
    }

    { // sum test
        uint32_t a[] = {1, 2, 4, 8, 16, 32};
        REQUIRE(sum(a, LEN(a)) == 63);
    }

    { // substring test
        uint8_t s[] = "hello world";
        uint8_t expected[] = "llo ";
        uint32_t len = 0;
        uint8_t *res = substring(s, 2, 5, &len);
        REQUIRE(STR_EQ(expected, res, LEN(expected)));
        REQUIRE(len == 4);
        free(res);
    }

    { // strlength test
        uint8_t s[] = "hello world!";
        REQUIRE(strlength(s) == LEN(s) - 1);
    }

    TEST_EXIT;
}